

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

bool DoSpawnDecal(AActor *actor,FDecalTemplate *tpl,int flags,DAngle *angle,double zofs,
                 double distance)

{
  double x;
  double y;
  double dVar1;
  double dVar2;
  double dVar3;
  sector_t *sec;
  DBaseDecal *pDVar4;
  double dVar5;
  DAngle local_30;
  
  if ((flags & 1U) == 0) {
    angle->Degrees = (actor->Angles).Yaw.Degrees + angle->Degrees;
  }
  sec = actor->Sector;
  x = (actor->__Pos).X;
  y = (actor->__Pos).Y;
  dVar1 = actor->Height;
  dVar2 = (actor->__Pos).Z;
  dVar3 = actor->Floorclip;
  dVar5 = AActor::GetBobOffset(actor,0.0);
  local_30 = (DAngle)angle->Degrees;
  pDVar4 = ShootDecal(tpl,actor,sec,x,y,((dVar1 * 0.5 + dVar2) - dVar3) + dVar5 + zofs,&local_30,
                      distance,SUB41((flags & 2U) >> 1,0));
  return pDVar4 != (DBaseDecal *)0x0;
}

Assistant:

static bool DoSpawnDecal(AActor *actor, const FDecalTemplate *tpl, int flags, DAngle angle, double zofs, double distance)
{
	if (!(flags & SDF_ABSANGLE))
	{
		angle += actor->Angles.Yaw;
	}
	return NULL != ShootDecal(tpl, actor, actor->Sector, actor->X(), actor->Y(),
		actor->Center() - actor->Floorclip + actor->GetBobOffset() + zofs,
		angle, distance, !!(flags & SDF_PERMANENT));
}